

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong
helper_precrq_rs_ph_w_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  
  if ((int)rs < 0x7fff8000) {
    uVar3 = (int)rs + 0x8000U & 0xffff0000;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar3 = 0x7fff0000;
  }
  if ((int)rt < 0x7fff8000) {
    uVar2 = (int)rt + 0x8000U >> 0x10;
  }
  else {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x40;
    uVar2 = 0x7fff;
  }
  return (long)(int)(uVar2 | uVar3);
}

Assistant:

static inline uint16_t mipsdsp_trunc16_sat16_round(int32_t a,
                                                   CPUMIPSState *env)
{
    uint16_t temp;


    /*
     * The value 0x00008000 will be added to the input Q31 value, and the code
     * needs to check if the addition causes an overflow. Since a positive value
     * is added, overflow can happen in one direction only.
     */
    if (a > 0x7FFF7FFF) {
        temp = 0x7FFF;
        set_DSPControl_overflow_flag(1, 22, env);
    } else {
        temp = ((a + 0x8000) >> 16) & 0xFFFF;
    }

    return temp;
}